

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O3

uint64_t pac_mult(uint64_t i)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar4 = 0xfffffffffffffffc;
  uVar2 = 0;
  do {
    cVar1 = (char)uVar4;
    uVar4 = uVar4 + 4;
    uVar6 = (uint)(i >> (cVar1 + 0x24U & 0x3f)) & 0xf;
    uVar7 = (uint)(i >> (cVar1 + 0x14U & 0x3f)) & 0xf;
    uVar9 = (uint)(i >> ((byte)uVar4 & 0x3f)) & 0xf;
    uVar10 = (uint)(i >> (cVar1 + 0x34U & 0x3f)) & 0xf;
    uVar6 = uVar6 << 4 | uVar6;
    uVar5 = uVar6 >> 3;
    uVar7 = uVar7 << 4 | uVar7;
    uVar9 = uVar9 << 4 | uVar9;
    uVar8 = uVar9 >> 3;
    uVar10 = uVar10 << 4 | uVar10;
    uVar11 = uVar10 >> 3;
    uVar3 = uVar7 >> 3;
    uVar2 = uVar2 | (ulong)((uVar7 >> 2 ^ uVar8 ^ uVar5) & 0xf) << (cVar1 + 0x34U & 0x3f) |
            ((ulong)((uVar9 >> 2 ^ uVar3 ^ uVar11) & 0xf) << (cVar1 + 0x24U & 0x3f)) +
            ((ulong)((uVar10 >> 2 ^ uVar8 ^ uVar5) & 0xf) << (cVar1 + 0x14U & 0x3f)) +
            ((ulong)((uVar6 >> 2 ^ uVar11 ^ uVar3) & 0xf) << ((byte)uVar4 & 0x3f));
  } while (uVar4 < 0xc);
  return uVar2;
}

Assistant:

static uint64_t pac_mult(uint64_t i)
{
    uint64_t o = 0;
    int b;

    for (b = 0; b < 4 * 4; b += 4) {
        int i0, i4, i8, ic, t0, t1, t2, t3;

        i0 = extract64(i, b, 4);
        i4 = extract64(i, b + 4 * 4, 4);
        i8 = extract64(i, b + 8 * 4, 4);
        ic = extract64(i, b + 12 * 4, 4);

        t0 = rot_cell(i8, 1) ^ rot_cell(i4, 2) ^ rot_cell(i0, 1);
        t1 = rot_cell(ic, 1) ^ rot_cell(i4, 1) ^ rot_cell(i0, 2);
        t2 = rot_cell(ic, 2) ^ rot_cell(i8, 1) ^ rot_cell(i0, 1);
        t3 = rot_cell(ic, 1) ^ rot_cell(i8, 2) ^ rot_cell(i4, 1);

        o |= (uint64_t)t3 << b;
        o |= (uint64_t)t2 << (b + 4 * 4);
        o |= (uint64_t)t1 << (b + 8 * 4);
        o |= (uint64_t)t0 << (b + 12 * 4);
    }
    return o;
}